

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::IsWindowAbove(ImGuiWindow *potential_above,ImGuiWindow *potential_below)

{
  ImGuiWindow *pIVar1;
  byte bVar2;
  ulong uVar3;
  
  bVar2 = 0x88;
  uVar3 = (ulong)(uint)(GImGui->Windows).Size;
  do {
    if ((int)uVar3 < 1) {
      return false;
    }
    pIVar1 = (GImGui->Windows).Data[uVar3 - 1];
    bVar2 = bVar2 & pIVar1 != potential_below | pIVar1 == potential_above;
  } while ((pIVar1 != potential_below) && (uVar3 = uVar3 - 1, pIVar1 != potential_above));
  return (bool)bVar2;
}

Assistant:

bool ImGui::IsWindowAbove(ImGuiWindow* potential_above, ImGuiWindow* potential_below)
{
    ImGuiContext& g = *GImGui;
    for (int i = g.Windows.Size - 1; i >= 0; i--)
    {
        ImGuiWindow* candidate_window = g.Windows[i];
        if (candidate_window == potential_above)
            return true;
        if (candidate_window == potential_below)
            return false;
    }
    return false;
}